

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  time_t tVar4;
  size_t t;
  lua_State *L;
  uint h;
  char buff [24];
  uint local_4c;
  lua_State *local_48;
  uint *local_40;
  code *local_38;
  
  pvVar3 = (*f)(ud,(void *)0x0,8,0x658);
  L = (lua_State *)0x0;
  if (pvVar3 != (void *)0x0) {
    L = (lua_State *)((long)pvVar3 + 8);
    *(undefined2 *)((long)pvVar3 + 0x10) = 0x808;
    *(undefined1 *)((long)pvVar3 + 0x134) = 8;
    *(long *)((long)pvVar3 + 0x20) = (long)pvVar3 + 0xd0;
    *(undefined8 *)((long)pvVar3 + 0x38) = 0;
    *(undefined8 *)((long)pvVar3 + 0x40) = 0;
    *(undefined8 *)((long)pvVar3 + 0x28) = 0;
    *(lua_State **)((long)pvVar3 + 0x58) = L;
    *(undefined8 *)((long)pvVar3 + 0x60) = 0;
    *(undefined8 *)((long)pvVar3 + 0xa8) = 0;
    *(undefined4 *)((long)pvVar3 + 200) = 0;
    *(undefined4 *)((long)pvVar3 + 0xc4) = 0;
    *(undefined4 *)((long)pvVar3 + 0x12) = 0x100;
    *(undefined8 *)((long)pvVar3 + 0xb0) = 0;
    *(undefined8 *)((long)pvVar3 + 0xbc) = 0;
    *(lua_State **)((long)pvVar3 + 0x140) = L;
    *(undefined8 *)((long)pvVar3 + 8) = 0;
    *(undefined4 *)((long)pvVar3 + 0xb8) = 0x10000;
    *(lua_Alloc *)((long)pvVar3 + 0xd0) = f;
    *(void **)((long)pvVar3 + 0xd8) = ud;
    *(undefined8 *)((long)pvVar3 + 0x648) = 0;
    *(undefined8 *)((long)pvVar3 + 0x650) = 0;
    *(lua_State **)((long)pvVar3 + 0x1d8) = L;
    tVar4 = time((time_t *)0x0);
    local_40 = &local_4c;
    local_4c = (uint)tVar4;
    local_38 = lua_newstate;
    local_48 = L;
    uVar1 = luaS_hash((char *)&local_48,0x18,local_4c);
    *(uint *)((long)pvVar3 + 0x130) = uVar1;
    *(undefined1 *)((long)pvVar3 + 0x118) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1d0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    *(undefined8 *)((long)pvVar3 + 0x108) = 0;
    memset((void *)((long)pvVar3 + 0x148),0,0x88);
    *(undefined8 *)((long)pvVar3 + 0xe0) = 0x658;
    *(undefined8 *)((long)pvVar3 + 0xe8) = 0;
    *(undefined8 *)((long)pvVar3 + 0xf8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x120) = 0;
    *(undefined1 *)((long)pvVar3 + 0x128) = 3;
    *(undefined2 *)((long)pvVar3 + 0x13d) = 0xd19;
    *(undefined8 *)((long)pvVar3 + 0x135) = 0x3200021914000008;
    *(undefined8 *)((long)pvVar3 + 0x2b0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2b8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2c0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2c8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2d0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2d8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2e0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2e8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2f0) = 0;
    iVar2 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state(L);
      L = (lua_State *)0x0;
    }
  }
  return L;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  L->tt = LUA_VTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  incnny(L);  /* main thread is always non yieldable */
  g->frealloc = f;
  g->ud = ud;
  g->warnf = NULL;
  g->ud_warn = NULL;
  g->mainthread = L;
  g->seed = luai_makeseed(L);
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->lastatomic = 0;
  setivalue(&g->nilvalue, 0);  /* to signal that state is not yet built */
  setgcparam(g->gcpause, LUAI_GCPAUSE);
  setgcparam(g->gcstepmul, LUAI_GCMUL);
  g->gcstepsize = LUAI_GCSTEPSIZE;
  setgcparam(g->genmajormul, LUAI_GENMAJORMUL);
  g->genminormul = LUAI_GENMINORMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}